

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O2

int LoadWebP(char *in_file,uint8_t **data,size_t *data_size,WebPBitstreamFeatures *bitstream)

{
  int iVar1;
  VP8StatusCode status;
  WebPBitstreamFeatures *features;
  int iVar2;
  WebPBitstreamFeatures local_features;
  
  iVar1 = ImgIoUtilReadFile(in_file,data,data_size);
  iVar2 = 0;
  if (iVar1 != 0) {
    features = &local_features;
    if (bitstream != (WebPBitstreamFeatures *)0x0) {
      features = bitstream;
    }
    status = WebPGetFeatures(*data,*data_size,features);
    if (status == VP8_STATUS_OK) {
      iVar2 = 1;
    }
    else {
      WebPFree(*data);
      *data = (uint8_t *)0x0;
      *data_size = 0;
      PrintWebPError(in_file,status);
    }
  }
  return iVar2;
}

Assistant:

int LoadWebP(const char* const in_file,
             const uint8_t** data, size_t* data_size,
             WebPBitstreamFeatures* bitstream) {
  VP8StatusCode status;
  WebPBitstreamFeatures local_features;
  if (!ImgIoUtilReadFile(in_file, data, data_size)) return 0;

  if (bitstream == NULL) {
    bitstream = &local_features;
  }

  status = WebPGetFeatures(*data, *data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    WebPFree((void*)*data);
    *data = NULL;
    *data_size = 0;
    PrintWebPError(in_file, status);
    return 0;
  }
  return 1;
}